

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsCreateTracedExternalObject
          (void *data,size_t inlineSlotSize,JsTraceCallback traceCallback,
          JsFinalizeCallback finalizeCallback,JsValueRef prototype,JsValueRef *object)

{
  anon_class_48_6_4aa32231 fn;
  JsErrorCode JVar1;
  JsValueRef *local_38;
  JsValueRef *object_local;
  JsValueRef prototype_local;
  JsFinalizeCallback finalizeCallback_local;
  JsTraceCallback traceCallback_local;
  size_t inlineSlotSize_local;
  void *data_local;
  
  fn.object = &local_38;
  fn.prototype = &object_local;
  fn.inlineSlotSize = (size_t *)&traceCallback_local;
  fn.data = (void **)&inlineSlotSize_local;
  fn.traceCallback = &finalizeCallback_local;
  fn.finalizeCallback = (JsFinalizeCallback *)&prototype_local;
  local_38 = object;
  object_local = (JsValueRef *)prototype;
  prototype_local = finalizeCallback;
  finalizeCallback_local = traceCallback;
  traceCallback_local = (JsTraceCallback)inlineSlotSize;
  inlineSlotSize_local = (size_t)data;
  JVar1 = ContextAPINoScriptWrapper<JsCreateTracedExternalObject::__0>(fn,false,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsCreateTracedExternalObject(
    _In_opt_ void *data,
    _In_opt_ size_t inlineSlotSize,
    _In_opt_ JsTraceCallback traceCallback,
    _In_opt_ JsFinalizeCallback finalizeCallback,
    _In_opt_ JsValueRef prototype,
    _Out_ JsValueRef *object)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateExternalObject, prototype);

        PARAM_NOT_NULL(object);

        Js::RecyclableObject * prototypeObject = nullptr;
        if (prototype != JS_INVALID_REFERENCE)
        {
            VALIDATE_INCOMING_OBJECT_OR_NULL(prototype, scriptContext);
            prototypeObject = Js::VarTo<Js::RecyclableObject>(prototype);
        }
        if (inlineSlotSize > UINT32_MAX)
        {
            return JsErrorInvalidArgument;
        }
        *object = JsrtExternalObject::Create(data, (uint)inlineSlotSize, traceCallback, finalizeCallback, prototypeObject, scriptContext, nullptr);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, object);

        return JsNoError;
    });
}